

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gengetopt_main1.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  pointer poVar4;
  pointer poVar5;
  char **argv_00;
  undefined8 uVar6;
  pointer ppcVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  option_results *poVar11;
  long lVar12;
  char **file;
  pointer ppcVar13;
  undefined1 *puVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<argagg::definition> __l_10;
  parser_results args;
  parser argparser;
  string flag_opt_arg;
  ostringstream usage;
  undefined1 auStack_838 [12];
  int local_82c;
  char **local_828;
  string *local_820;
  allocator_type local_814;
  allocator_type local_813;
  allocator_type local_812;
  allocator_type local_811;
  allocator_type local_810;
  allocator_type local_80f;
  allocator_type local_80e;
  allocator_type local_80d;
  allocator_type local_80c;
  allocator_type local_80b;
  allocator_type local_80a;
  allocator_type local_809;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  string *local_7c8;
  string *local_7c0;
  string *local_7b8;
  string *local_7b0;
  string *local_7a8;
  string *local_7a0;
  undefined1 local_798 [32];
  size_t *psStack_778;
  float local_770;
  size_t local_768;
  __node_base_ptr p_Stack_760;
  pointer local_758;
  pointer ppcStack_750;
  pointer local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  parser local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  undefined1 local_608 [8];
  undefined1 local_600 [48];
  _Alloc_hider local_5d0;
  pointer local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5c0;
  uint local_5b0;
  undefined8 **local_5a8 [2];
  undefined8 *local_598;
  code *local_590;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_588;
  undefined1 *local_570 [2];
  undefined1 local_560 [16];
  undefined4 local_550;
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_528;
  undefined1 *local_510 [2];
  undefined1 local_500 [16];
  undefined4 local_4f0;
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  undefined1 *local_450 [2];
  undefined1 local_440 [16];
  undefined4 local_430;
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  undefined4 local_370;
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined4 local_310;
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined4 local_2b0;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined4 local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined4 local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  undefined1 *local_188 [2];
  undefined1 local_178 [64];
  ios_base local_138 [264];
  
  local_608 = (undefined1  [8])(local_600 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"help","");
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-h","");
  local_7a0 = (string *)local_188;
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>(local_7a0,"--help","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_1a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_600 + 0x18),__l,&local_809);
  local_5d0._M_p = (pointer)&aStack_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"Print help and exit","");
  local_820 = (string *)local_5a8;
  local_5b0 = 0;
  local_5a8[0] = &local_598;
  local_82c = argc;
  std::__cxx11::string::_M_construct<char_const*>(local_820,"version","");
  local_798._0_8_ = local_798 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"-V","");
  local_7a8 = (string *)&psStack_778;
  psStack_778 = &local_768;
  std::__cxx11::string::_M_construct<char_const*>(local_7a8,"--version","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_798;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_588,__l_00,&local_80a);
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"Print version and exit","");
  local_820 = (string *)local_548;
  local_550 = 0;
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>(local_820,"str-opt","");
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  local_828 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"-s","");
  local_7b0 = (string *)local_7e8;
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>(local_7b0,"--str-opt","");
  __l_01._M_len = 2;
  __l_01._M_array = &local_808;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_528,__l_01,&local_80b);
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_510,"A string option, for a filename","");
  local_820 = (string *)local_4e8;
  local_4f0 = 1;
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>(local_820,"my-opt","");
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"-m","");
  local_7b8 = (string *)local_720;
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>(local_7b8,"--my-opt","");
  __l_02._M_len = 2;
  __l_02._M_array = &local_740;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4c8,__l_02,&local_80c);
  local_4b0 = &uStack_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Another integer option","");
  local_820 = (string *)local_488;
  uStack_490._0_4_ = 1;
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>(local_820,"int-opt","");
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"-i","");
  local_7c0 = (string *)local_6e0;
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>(local_7c0,"--int-opt","");
  __l_03._M_len = 2;
  __l_03._M_array = &local_700;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_468,__l_03,&local_80d);
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"A int option","");
  local_430 = 1;
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"flag-opt","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"--flag-opt","");
  __l_04._M_len = 1;
  __l_04._M_array = &local_628;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_408,__l_04,&local_80e);
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f0,"A flag option (default: off)","");
  local_3d0 = 0;
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"funct-opt","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"-F","");
  local_7c8 = (string *)local_1c8;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>(local_7c8,"--funct-opt","");
  __l_05._M_len = 2;
  __l_05._M_array = &local_1e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,__l_05,&local_80f);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"A function option","");
  local_370 = 0;
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"long-opt","");
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"--long-opt","");
  __l_06._M_len = 1;
  __l_06._M_array = &local_648;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_348,__l_06,&local_810);
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"A long option","");
  local_310 = 1;
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"def-opt","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"--def-opt","");
  __l_07._M_len = 1;
  __l_07._M_array = &local_668;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e8,__l_07,&local_811);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"A string option with default (default: \'Hello\')","");
  local_2b0 = 1;
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"enum-opt","");
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"--enum-opt","");
  __l_08._M_len = 1;
  __l_08._M_array = &local_688;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_288,__l_08,&local_812);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,
             "A string option with list of values (possible values=\"foo\", \"bar\", \"hello\", \"bye\"; default=\"hello\")"
             ,"");
  local_820 = (string *)local_248;
  local_250 = 1;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>(local_820,"dependant","");
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"--dependant","");
  __l_09._M_len = 1;
  __l_09._M_array = &local_6a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228,__l_09,&local_813);
  puVar14 = local_200;
  local_210[0] = puVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"option that depends on str-opt","");
  local_1f0 = 1;
  __l_10._M_len = 0xb;
  __l_10._M_array = (iterator)local_608;
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::vector
            (&local_6c0.definitions,__l_10,&local_814);
  argv_00 = local_828;
  lVar12 = -0x420;
  do {
    if (puVar14 != *(undefined1 **)(puVar14 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar14 + -0x10));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(puVar14 + -0x28));
    if (puVar14 + -0x38 != *(undefined1 **)(puVar14 + -0x48)) {
      operator_delete(*(undefined1 **)(puVar14 + -0x48));
    }
    puVar14 = puVar14 + -0x60;
    lVar12 = lVar12 + 0x60;
  } while (lVar12 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p);
  }
  lVar12 = 0;
  do {
    if (local_1b8 + lVar12 != *(undefined1 **)((long)local_1c8 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_1c8 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  lVar12 = 0;
  do {
    if (local_6d0 + lVar12 != *(undefined1 **)((long)local_6e0 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_6e0 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x40);
  lVar12 = 0;
  do {
    if (local_710 + lVar12 != *(undefined1 **)((long)local_720 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_720 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x40);
  lVar12 = 0;
  do {
    if (local_7d8 + lVar12 != *(undefined1 **)((long)local_7e8 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_7e8 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x40);
  lVar12 = 0;
  do {
    if ((void *)((long)&local_768 + lVar12) != *(void **)((long)&psStack_778 + lVar12)) {
      operator_delete(*(void **)((long)&psStack_778 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x40);
  lVar12 = 0;
  do {
    if (local_178 + lVar12 != *(undefined1 **)((long)local_188 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_188 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This one is from a C++ program\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Try to launch me with some options\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(type ",6);
  pcVar3 = *argv_00;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x114178);
  }
  else {
    sVar9 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," --help for the complete list)\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"For example: ",0xd);
  pcVar3 = *argv_00;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x114178);
  }
  else {
    sVar9 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," *.* --funct-opt\n",0x11);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = *argv_00;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_838 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x690);
  }
  else {
    sVar9 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," 2.0\n",5);
  local_608[0] = 10;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_608,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Usage: ",7);
  pcVar3 = *argv_00;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar3,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," [OPTIONS]... [FILES]...\n",0x19);
  local_608[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_608,1);
  local_798._8_8_ = &p_Stack_760;
  local_798._16_8_ = 1;
  local_798._24_8_ = 0;
  psStack_778 = (size_t *)0x0;
  local_770 = 1.0;
  local_768 = 0;
  p_Stack_760 = (__node_base_ptr)0x0;
  local_758 = (pointer)0x0;
  ppcStack_750 = (pointer)0x0;
  local_748 = (pointer)0x0;
  argagg::parser::parse((parser_results *)local_608,&local_6c0,local_82c,argv_00);
  local_798._0_8_ = local_608;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_798 + 8),
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_600);
  ppcVar7 = local_758;
  local_758 = local_5c8;
  ppcStack_750 = (pointer)aStack_5c0._M_allocated_capacity;
  local_748 = (pointer)aStack_5c0._8_8_;
  local_5c8 = (pointer)0x0;
  aStack_5c0._M_allocated_capacity = 0;
  aStack_5c0._8_8_ = 0;
  if (ppcVar7 != (pointer)0x0) {
    operator_delete(ppcVar7);
  }
  if (local_5c8 != (pointer)0x0) {
    operator_delete(local_5c8);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_600);
  local_608 = (undefined1  [8])(local_600 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"help","");
  poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
  poVar4 = (poVar11->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_start;
  poVar5 = (poVar11->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (local_608 != (undefined1  [8])(local_600 + 8)) {
    operator_delete((void *)local_608);
  }
  if (poVar5 == poVar4) {
    local_608 = (undefined1  [8])(local_600 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"version","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
    if (poVar5 != poVar4) {
      iVar8 = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"2.0\n",4);
      goto LAB_001094d1;
    }
    local_608 = (undefined1  [8])(local_600 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"int-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
    uVar6 = local_798._0_8_;
    if (poVar5 == poVar4) {
      if ((char *)local_798._0_8_ == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1142c0);
      }
      else {
        sVar9 = strlen((char *)local_798._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)uVar6,sVar9);
      }
      iVar8 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,": \'--int-opt\' (\'-i\') option required\n",0x25);
      goto LAB_001094d1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Here are the options you passed...\n",0x23);
    ppcVar7 = ppcStack_750;
    if (local_758 != ppcStack_750) {
      ppcVar13 = local_758;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file: ",6);
        pcVar3 = *ppcVar13;
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x114178);
        }
        else {
          sVar9 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar9);
        }
        local_608[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_608,1);
        ppcVar13 = ppcVar13 + 1;
      } while (ppcVar13 != ppcVar7);
    }
    local_608 = (undefined1  [8])(local_600 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"funct-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
    paVar1 = &local_808.field_2;
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
    if (poVar5 != poVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"You chose --funct-opt or -F.\n",0x1d);
    }
    local_608 = (undefined1  [8])(local_600 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"str-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
    if (poVar5 != poVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You inserted ",0xd);
      local_808._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"str-opt","");
      poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,&local_808);
      argagg::option_results::as<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                 poVar11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_608,local_600._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," for ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--str-opt option.\n",0x12);
      if (local_608 != (undefined1  [8])(local_600 + 8)) {
        operator_delete((void *)local_608);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._M_dataplus._M_p != paVar1) {
        operator_delete(local_808._M_dataplus._M_p);
      }
    }
    local_608 = (undefined1  [8])(local_600 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"int-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
    if (poVar5 != poVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"This is the integer you input: ",0x1f);
      local_608 = (undefined1  [8])(local_600 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"int-opt","");
      poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,(string *)local_608);
      iVar8 = argagg::option_results::as<int>(poVar11);
      poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
      if (local_608 != (undefined1  [8])(local_600 + 8)) {
        operator_delete((void *)local_608);
      }
    }
    local_608 = (undefined1  [8])(local_600 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"off","");
    local_808._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"flag-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,&local_808);
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != paVar1) {
      operator_delete(local_808._M_dataplus._M_p);
    }
    if (poVar5 != poVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The flag option was given!\n",0x1b);
      std::__cxx11::string::_M_replace((ulong)local_608,0,(char *)local_600._0_8_,0x10f048);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The flag is ",0xc);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_608,local_600._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
    local_808._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"enum-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,&local_808);
    poVar4 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    poVar5 = (poVar11->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != paVar1) {
      operator_delete(local_808._M_dataplus._M_p);
    }
    paVar2 = &local_740.field_2;
    if (poVar5 != poVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"enum-opt value: ",0x10);
      local_740._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"enum-opt","");
      poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,&local_740);
      argagg::option_results::as<std::__cxx11::string>(&local_808,poVar11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_808._M_dataplus._M_p,
                           local_808._M_string_length);
      local_700._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_700,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._M_dataplus._M_p != paVar1) {
        operator_delete(local_808._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_740._M_dataplus._M_p != paVar2) {
        operator_delete(local_740._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"enum-opt (original specified) value: hello\n",0x2b);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"def_opt: ",9);
    local_740._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"def-opt","");
    poVar11 = argagg::parser_results::operator[]((parser_results *)local_798,&local_740);
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"Hello","");
    argagg::option_results::as<std::__cxx11::string>(&local_808,poVar11,&local_700);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_808._M_dataplus._M_p,local_808._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"! ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != paVar1) {
      operator_delete(local_808._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != paVar2) {
      operator_delete(local_740._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Have a nice day! :-)\n",0x15);
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
  }
  else {
    std::ios_base::ios_base((ios_base *)&local_590);
    local_590 = std::terminate;
    local_4c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b0 = (undefined8 *)((ulong)local_4b0 & 0xffffffffffff0000);
    local_4a8 = 0;
    uStack_4a0 = 0;
    local_498 = 0;
    uStack_490 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    local_608 = (undefined1  [8])(argagg::fmt_ostream::vtable + 0x18);
    local_590 = (code *)0x112b28;
    local_598 = &std::cerr;
    std::__cxx11::stringbuf::str();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_608,local_808._M_dataplus._M_p,local_808._M_string_length)
    ;
    operator<<(poVar10,&local_6c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p);
    }
    argagg::fmt_ostream::~fmt_ostream((fmt_ostream *)local_608,&argagg::fmt_ostream::VTT);
    std::ios_base::~ios_base((ios_base *)&local_590);
  }
  iVar8 = 0;
LAB_001094d1:
  if (local_758 != (pointer)0x0) {
    operator_delete(local_758);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_798 + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::~vector
            (&local_6c0.definitions);
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{
  using argagg::parser_results;
  using argagg::parser;
  using std::cerr;
  using std::cout;
  using std::ofstream;
  using std::ostream;
  using std::ostringstream;
  using std::string;

  parser argparser {{
      {
        "help", {"-h", "--help"},
        "Print help and exit", 0},
      {
        "version", {"-V", "--version"},
        "Print version and exit", 0},
      {
        "str-opt", {"-s", "--str-opt"},
        "A string option, for a filename", 1},
      {
        "my-opt", {"-m", "--my-opt"},
        "Another integer option", 1},
      {
        "int-opt", {"-i", "--int-opt"},
        "A int option", 1},
      {
        "flag-opt", {"--flag-opt"},
        "A flag option (default: off)", 0},
      {
        "funct-opt", {"-F", "--funct-opt"},
        "A function option", 0},
      {
        "long-opt", {"--long-opt"},
        "A long option", 1},
      {
        "def-opt", {"--def-opt"},
        "A string option with default (default: 'Hello')", 1},
      {
        "enum-opt", {"--enum-opt"},
        "A string option with list of values (possible values=\"foo\", "
        "\"bar\", \"hello\", \"bye\"; default=\"hello\")", 1},
      {
        "dependant", {"--dependant"},
        "option that depends on str-opt", 1},
    }};

  cout
    << "This one is from a C++ program\n"
    << "Try to launch me with some options\n"
    << "(type " << argv[0] << " --help for the complete list)\n"
    << "For example: " << argv[0] << " *.* --funct-opt\n";

  // Define our usage text.
  ostringstream usage;
  usage
    << argv[0] << " 2.0\n"
    << '\n'
    << "Usage: " << argv[0] << " [OPTIONS]... [FILES]...\n"
    << '\n';

  // Use our argument parser to... parse the command line arguments. If there
  // are any problems then just spit out the usage and help text and exit.
  argagg::parser_results args;
  try {
    args = argparser.parse(argc, argv);
  } catch (const std::exception& e) {
    argagg::fmt_ostream fmt(cerr);
    fmt << usage.str() << argparser << '\n'
        << "Encountered exception while parsing arguments: " << e.what()
        << '\n';
    return EXIT_FAILURE;
  }

  // If the help flag was specified then spit out the usage and help text and
  // exit.
  if (args["help"]) {
    argagg::fmt_ostream fmt(cerr);
    fmt << usage.str() << argparser;
    return EXIT_SUCCESS;
  }

  if (args["version"]) {
    cerr << "2.0\n";
    return EXIT_SUCCESS;
  }

  if (!args["int-opt"]) {
    cerr << args.program << ": '--int-opt' ('-i') option required\n";
    return EXIT_FAILURE;
  }

  cout << "Here are the options you passed...\n";

  for (const auto& file : args.pos) {
    cout << "file: " << file << '\n';
  }

  if (args["funct-opt"]) {
    cout << "You chose --funct-opt or -F.\n";
  }

  if (args["str-opt"]) {
    cout << "You inserted " << args["str-opt"].as<std::string>() << " for " <<
      "--str-opt option.\n";
  }

  if (args["int-opt"]) {
    cout << "This is the integer you input: " << args["int-opt"].as<int>()
      << ".\n";
  }

  string flag_opt_arg = "off";
  if (args["flag-opt"]) {
    cout << "The flag option was given!\n";
    flag_opt_arg = "on";
  }
  cout << "The flag is " << flag_opt_arg << ".\n";

  if (args["enum-opt"]) {
    cout << "enum-opt value: " << args["enum-opt"].as<string>() << '\n';
    cout << "enum-opt (original specified) value: hello\n";
  }

  cout << "def_opt: " << args["def-opt"].as<string>("Hello") << "! ";

  cout << "Have a nice day! :-)\n";

  return EXIT_SUCCESS;
}